

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

size_t __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ExplicitProducer::
dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
          (ExplicitProducer *this,
          __normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
          *itemFirst,size_t max)

{
  ExplicitProducer *pEVar1;
  _Atomic_word *p_Var2;
  ulong uVar3;
  long *plVar4;
  BufferEvictionNode *pBVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  ulong uVar8;
  BufferEvictionNode *pBVar9;
  long lVar10;
  ulong uVar11;
  BufferEvictionNode *pBVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar8 = (*(long *)(this + 0x38) - *(long *)(this + 0x30)) + *(long *)(this + 0x20);
  if (0 < (long)uVar8) {
    if (uVar8 < max) {
      max = uVar8;
    }
    LOCK();
    pEVar1 = this + 0x30;
    lVar10 = *(long *)pEVar1;
    *(size_t *)pEVar1 = *(long *)pEVar1 + max;
    UNLOCK();
    uVar8 = (*(long *)(this + 0x38) - lVar10) + *(long *)(this + 0x20);
    if (0 < (long)uVar8) {
      uVar14 = uVar8;
      if (max < uVar8) {
        uVar14 = max;
      }
      if (uVar8 < max) {
        LOCK();
        *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + (max - uVar14);
        UNLOCK();
      }
      LOCK();
      pEVar1 = this + 0x28;
      uVar8 = *(ulong *)pEVar1;
      *(ulong *)pEVar1 = *(ulong *)pEVar1 + uVar14;
      UNLOCK();
      plVar4 = *(long **)(this + 0x58);
      lVar13 = (uVar8 & 0xffffffffffffffe0) - *(long *)(plVar4[2] + plVar4[1] * 0x10);
      lVar10 = lVar13 + 0x1f;
      if (-1 < lVar13) {
        lVar10 = lVar13;
      }
      uVar11 = *plVar4 - 1U & (lVar10 >> 5) + plVar4[1];
      uVar3 = uVar8 + uVar14;
      do {
        uVar15 = (uVar8 & 0xffffffffffffffe0) + 0x20;
        if (0x8000000000000000 < uVar3 - uVar15) {
          uVar15 = uVar3;
        }
        uVar16 = uVar8;
        if (uVar8 != uVar15) {
          lVar10 = *(long *)(plVar4[2] + 8 + uVar11 * 0x10);
          do {
            pBVar12 = (BufferEvictionNode *)((ulong)((uint)uVar16 & 0x1f) * 0x18 + lVar10);
            pBVar5 = itemFirst->_M_current;
            pBVar9 = pBVar5;
            if (pBVar5 != pBVar12) {
              (pBVar5->handle).internal.
              super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (pBVar12->handle).internal.
                   super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(pBVar5->handle).internal.
                          super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         &(pBVar12->handle).internal.
                          super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              pBVar9 = itemFirst->_M_current;
            }
            pBVar5->handle_sequence_number = pBVar12->handle_sequence_number;
            itemFirst->_M_current = pBVar9 + 1;
            p_Var6 = (pBVar12->handle).internal.
                     super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = &p_Var6->_M_weak_count;
                iVar7 = *p_Var2;
                *p_Var2 = *p_Var2 + -1;
                UNLOCK();
              }
              else {
                iVar7 = p_Var6->_M_weak_count;
                p_Var6->_M_weak_count = iVar7 + -1;
              }
              if (iVar7 == 1) {
                (*p_Var6->_vptr__Sp_counted_base[3])();
              }
            }
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
          lVar13 = uVar8 - uVar15;
          uVar16 = uVar15;
          if (lVar13 != 0) {
            do {
              *(undefined1 *)((lVar10 - (ulong)((uint)uVar8 & 0x1f)) + 0x330 + lVar13) = 1;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0);
          }
        }
        uVar11 = uVar11 + 1 & *plVar4 - 1U;
        uVar8 = uVar16;
      } while (uVar16 != uVar3);
      return uVar14;
    }
    LOCK();
    *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + max;
    UNLOCK();
  }
  return 0;
}

Assistant:

size_t dequeue_bulk(It& itemFirst, size_t max)
		{
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto overcommit = this->dequeueOvercommit.load(std::memory_order_relaxed);
			auto desiredCount = static_cast<size_t>(tail - (this->dequeueOptimisticCount.load(std::memory_order_relaxed) - overcommit));
			if (details::circular_less_than<size_t>(0, desiredCount)) {
				desiredCount = desiredCount < max ? desiredCount : max;
				std::atomic_thread_fence(std::memory_order_acquire);
				
				auto myDequeueCount = this->dequeueOptimisticCount.fetch_add(desiredCount, std::memory_order_relaxed);;
				
				tail = this->tailIndex.load(std::memory_order_acquire);
				auto actualCount = static_cast<size_t>(tail - (myDequeueCount - overcommit));
				if (details::circular_less_than<size_t>(0, actualCount)) {
					actualCount = desiredCount < actualCount ? desiredCount : actualCount;
					if (actualCount < desiredCount) {
						this->dequeueOvercommit.fetch_add(desiredCount - actualCount, std::memory_order_release);
					}
					
					// Get the first index. Note that since there's guaranteed to be at least actualCount elements, this
					// will never exceed tail.
					auto firstIndex = this->headIndex.fetch_add(actualCount, std::memory_order_acq_rel);
					
					// Determine which block the first element is in
					auto localBlockIndex = blockIndex.load(std::memory_order_acquire);
					auto localBlockIndexHead = localBlockIndex->front.load(std::memory_order_acquire);
					
					auto headBase = localBlockIndex->entries[localBlockIndexHead].base;
					auto firstBlockBaseIndex = firstIndex & ~static_cast<index_t>(BLOCK_SIZE - 1);
					auto offset = static_cast<size_t>(static_cast<typename std::make_signed<index_t>::type>(firstBlockBaseIndex - headBase) / static_cast<typename std::make_signed<index_t>::type>(BLOCK_SIZE));
					auto indexIndex = (localBlockIndexHead + offset) & (localBlockIndex->size - 1);
					
					// Iterate the blocks and dequeue
					auto index = firstIndex;
					do {
						auto firstIndexInBlock = index;
						auto endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
						endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
						auto block = localBlockIndex->entries[indexIndex].block;
						if (MOODYCAMEL_NOEXCEPT_ASSIGN(T, T&&, details::deref_noexcept(itemFirst) = std::move((*(*block)[index])))) {
							while (index != endIndex) {
								auto& el = *((*block)[index]);
								*itemFirst++ = std::move(el);
								el.~T();
								++index;
							}
						}
						else {
							MOODYCAMEL_TRY {
								while (index != endIndex) {
									auto& el = *((*block)[index]);
									*itemFirst = std::move(el);
									++itemFirst;
									el.~T();
									++index;
								}
							}
							MOODYCAMEL_CATCH (...) {
								// It's too late to revert the dequeue, but we can make sure that all
								// the dequeued objects are properly destroyed and the block index
								// (and empty count) are properly updated before we propagate the exception
								do {
									block = localBlockIndex->entries[indexIndex].block;
									while (index != endIndex) {
										(*block)[index++]->~T();
									}
									block->ConcurrentQueue::Block::template set_many_empty<explicit_context>(firstIndexInBlock, static_cast<size_t>(endIndex - firstIndexInBlock));
									indexIndex = (indexIndex + 1) & (localBlockIndex->size - 1);
									
									firstIndexInBlock = index;
									endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
									endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
								} while (index != firstIndex + actualCount);
								
								MOODYCAMEL_RETHROW;
							}
						}
						block->ConcurrentQueue::Block::template set_many_empty<explicit_context>(firstIndexInBlock, static_cast<size_t>(endIndex - firstIndexInBlock));
						indexIndex = (indexIndex + 1) & (localBlockIndex->size - 1);
					} while (index != firstIndex + actualCount);
					
					return actualCount;
				}
				else {
					// Wasn't anything to dequeue after all; make the effective dequeue count eventually consistent
					this->dequeueOvercommit.fetch_add(desiredCount, std::memory_order_release);
				}
			}
			
			return 0;
		}